

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::mergeTrees(TIntermediate *this,TInfoSink *infoSink,TIntermediate *unit)

{
  size_t unitLinkerObjects_00;
  int iVar1;
  int iVar2;
  EShLanguage unitStage;
  undefined4 extraout_var;
  TIntermSequence *globals_00;
  undefined4 extraout_var_00;
  TIntermSequence *unitGlobals_00;
  TIntermAggregate *pTVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  iterator __first;
  iterator __last;
  long lStack_128;
  bool mergeExistingOnly;
  longlong idShift;
  TIdMaps idMaps;
  TIntermSequence *unitLinkerObjects;
  TIntermSequence *linkerObjects;
  TIntermSequence *unitGlobals;
  TIntermSequence *globals;
  TIntermediate *unit_local;
  TInfoSink *infoSink_local;
  TIntermediate *this_local;
  
  if (unit->treeRoot != (TIntermNode *)0x0) {
    if (this->treeRoot == (TIntermNode *)0x0) {
      this->treeRoot = unit->treeRoot;
    }
    else {
      this->numShaderRecordBlocks = unit->numShaderRecordBlocks + this->numShaderRecordBlocks;
      this->numTaskNVBlocks = unit->numTaskNVBlocks + this->numTaskNVBlocks;
      iVar1 = (*this->treeRoot->_vptr_TIntermNode[6])();
      globals_00 = (TIntermSequence *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 400))();
      iVar1 = (*unit->treeRoot->_vptr_TIntermNode[6])();
      unitGlobals_00 =
           (TIntermSequence *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 400))();
      pTVar3 = findLinkerObjects(this);
      iVar1 = (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      pTVar3 = findLinkerObjects(unit);
      iVar2 = (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      idMaps.maps[3].
      super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count = CONCAT44(extraout_var_02,iVar2);
      TIdMaps::TIdMaps((TIdMaps *)&idShift);
      seedIdMap(this,(TIdMaps *)&idShift,&stack0xfffffffffffffed8);
      remapIds(this,(TIdMaps *)&idShift,lStack_128 + 1,unit);
      mergeBodies(this,infoSink,globals_00,unitGlobals_00);
      mergeGlobalUniformBlocks(this,infoSink,unit,false);
      unitLinkerObjects_00 =
           idMaps.maps[3].
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_node_count;
      unitStage = getStage(unit);
      mergeLinkerObjects(this,infoSink,(TIntermSequence *)CONCAT44(extraout_var_01,iVar1),
                         (TIntermSequence *)unitLinkerObjects_00,unitStage);
      __first = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                ::begin(&unit->ioAccessed);
      __last = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
               ::end(&unit->ioAccessed);
      std::
      set<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
      ::
      insert<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                ((set<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                  *)&this->ioAccessed,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
                  )__first._M_node,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
                  )__last._M_node);
      TIdMaps::~TIdMaps((TIdMaps *)&idShift);
    }
  }
  return;
}

Assistant:

void TIntermediate::mergeTrees(TInfoSink& infoSink, TIntermediate& unit)
{
    if (unit.treeRoot == nullptr)
        return;

    if (treeRoot == nullptr) {
        treeRoot = unit.treeRoot;
        return;
    }

    // Getting this far means we have two existing trees to merge...
    numShaderRecordBlocks += unit.numShaderRecordBlocks;
    numTaskNVBlocks += unit.numTaskNVBlocks;

    // Get the top-level globals of each unit
    TIntermSequence& globals = treeRoot->getAsAggregate()->getSequence();
    TIntermSequence& unitGlobals = unit.treeRoot->getAsAggregate()->getSequence();

    // Get the linker-object lists
    TIntermSequence& linkerObjects = findLinkerObjects()->getSequence();
    const TIntermSequence& unitLinkerObjects = unit.findLinkerObjects()->getSequence();

    // Map by global name to unique ID to rationalize the same object having
    // differing IDs in different trees.
    TIdMaps idMaps;
    long long idShift;
    seedIdMap(idMaps, idShift);
    remapIds(idMaps, idShift + 1, unit);

    mergeBodies(infoSink, globals, unitGlobals);
    bool mergeExistingOnly = false;
    mergeGlobalUniformBlocks(infoSink, unit, mergeExistingOnly);
    mergeLinkerObjects(infoSink, linkerObjects, unitLinkerObjects, unit.getStage());
    ioAccessed.insert(unit.ioAccessed.begin(), unit.ioAccessed.end());
}